

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LICMPass::IsImmediatelyContainedInLoop
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb)

{
  uint32_t block_id;
  LoopDescriptor *this_00;
  Loop *pLVar1;
  
  this_00 = IRContext::GetLoopDescriptor((this->super_Pass).context_,f);
  block_id = BasicBlock::id(bb);
  pLVar1 = LoopDescriptor::FindLoopForBasicBlock(this_00,block_id);
  return pLVar1 == loop;
}

Assistant:

bool LICMPass::IsImmediatelyContainedInLoop(Loop* loop, Function* f,
                                            BasicBlock* bb) {
  LoopDescriptor* loop_descriptor = context()->GetLoopDescriptor(f);
  return loop == (*loop_descriptor)[bb->id()];
}